

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void google::protobuf::util::MatchIndicesPostProcessorForSmartList
               (vector<int,_std::allocator<int>_> *match_list1,
               vector<int,_std::allocator<int>_> *match_list2)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_28;
  size_t i;
  int last_matched_index;
  vector<int,_std::allocator<int>_> *match_list2_local;
  vector<int,_std::allocator<int>_> *match_list1_local;
  
  i._4_4_ = -1;
  for (local_28 = 0; sVar1 = std::vector<int,_std::allocator<int>_>::size(match_list1),
      local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list1,local_28);
    if (-1 < *pvVar2) {
      if ((i._4_4_ < 0) ||
         (pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list1,local_28),
         i._4_4_ < *pvVar2)) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list1,local_28);
        i._4_4_ = *pvVar2;
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list1,local_28);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list2,(long)*pvVar2);
        *pvVar2 = -1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::at(match_list1,local_28);
        *pvVar2 = -1;
      }
    }
  }
  return;
}

Assistant:

void MatchIndicesPostProcessorForSmartList(std::vector<int>* match_list1,
                                           std::vector<int>* match_list2) {
  int last_matched_index = -1;
  for (size_t i = 0; i < match_list1->size(); ++i) {
    if (match_list1->at(i) < 0) {
      continue;
    }
    if (last_matched_index < 0 || match_list1->at(i) > last_matched_index) {
      last_matched_index = match_list1->at(i);
    } else {
      match_list2->at(match_list1->at(i)) = -1;
      match_list1->at(i) = -1;
    }
  }
}